

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerHLSL::emit_store(CompilerHLSL *this,Instruction *instruction)

{
  uint32_t value;
  uint32_t *puVar1;
  SPIRExpression *pSVar2;
  SPIRAccessChain *chain_00;
  SmallVector<unsigned_int,_8UL> local_b8;
  SPIRAccessChain *local_80;
  SPIRAccessChain *chain;
  undefined1 local_68 [8];
  string rhs;
  undefined1 local_48 [8];
  string lhs;
  SPIRExpression *expr;
  uint32_t *ops;
  Instruction *instruction_local;
  CompilerHLSL *this_local;
  
  puVar1 = Compiler::stream((Compiler *)this,instruction);
  if (((((this->super_CompilerGLSL).options.vertex.flip_vert_y & 1U) == 0) ||
      (pSVar2 = Compiler::maybe_get<spirv_cross::SPIRExpression>((Compiler *)this,*puVar1),
      pSVar2 == (SPIRExpression *)0x0)) || ((pSVar2->access_meshlet_position_y & 1U) == 0)) {
    chain_00 = Compiler::maybe_get<spirv_cross::SPIRAccessChain>((Compiler *)this,*puVar1);
    local_80 = chain_00;
    if (chain_00 == (SPIRAccessChain *)0x0) {
      CompilerGLSL::emit_instruction(&this->super_CompilerGLSL,instruction);
    }
    else {
      value = puVar1[1];
      SmallVector<unsigned_int,_8UL>::SmallVector(&local_b8);
      write_access_chain(this,chain_00,value,&local_b8);
      SmallVector<unsigned_int,_8UL>::~SmallVector(&local_b8);
    }
  }
  else {
    CompilerGLSL::to_dereferenced_expression_abi_cxx11_
              ((CompilerGLSL *)local_48,(uint32_t)this,SUB41(*puVar1,0));
    CompilerGLSL::to_unpacked_expression_abi_cxx11_
              ((CompilerGLSL *)local_68,(uint32_t)this,SUB41(puVar1[1],0));
    CompilerGLSL::
    statement<std::__cxx11::string&,char_const(&)[17],std::__cxx11::string&,char_const(&)[3]>
              (&this->super_CompilerGLSL,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
               (char (*) [17])" = spvFlipVertY(",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
               (char (*) [3])0x5e9b6f);
    Compiler::register_write((Compiler *)this,*puVar1);
    ::std::__cxx11::string::~string((string *)local_68);
    ::std::__cxx11::string::~string((string *)local_48);
  }
  return;
}

Assistant:

void CompilerHLSL::emit_store(const Instruction &instruction)
{
	auto ops = stream(instruction);
	if (options.vertex.flip_vert_y)
	{
		auto *expr = maybe_get<SPIRExpression>(ops[0]);
		if (expr != nullptr && expr->access_meshlet_position_y)
		{
			auto lhs = to_dereferenced_expression(ops[0]);
			auto rhs = to_unpacked_expression(ops[1]);
			statement(lhs, " = spvFlipVertY(", rhs, ");");
			register_write(ops[0]);
			return;
		}
	}

	auto *chain = maybe_get<SPIRAccessChain>(ops[0]);
	if (chain)
		write_access_chain(*chain, ops[1], {});
	else
		CompilerGLSL::emit_instruction(instruction);
}